

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall google::protobuf::Message::CheckInitialized(Message *this)

{
  char *pcVar1;
  bool bVar2;
  LogMessage *pLVar3;
  Metadata MVar4;
  string_view v;
  LogMessage local_40;
  string local_30;
  
  bVar2 = MessageLite::IsInitialized(&this->super_MessageLite);
  if (bVar2) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
             ,0x92,"IsInitialized()");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_40,(char (*) [18])"Message of type \"");
  MVar4 = GetMetadata(this);
  pcVar1 = ((MVar4.descriptor)->all_names_).payload_;
  v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v._M_str = pcVar1 + ~v._M_len;
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar3,(char (*) [31])"\" is missing required fields: ");
  InitializationErrorString_abi_cxx11_(&local_30,this);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void Message::CheckInitialized() const {
  ABSL_CHECK(IsInitialized())
      << "Message of type \"" << GetDescriptor()->full_name()
      << "\" is missing required fields: " << InitializationErrorString();
}